

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void freeattr(attr *a)

{
  int *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = *in_RDI;
  if (iVar1 == 1) {
    freeattr((attr *)CONCAT44(1,in_stack_fffffffffffffff0));
    free(*(void **)(in_RDI + 2));
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        freeattr((attr *)CONCAT44(3,in_stack_fffffffffffffff0));
        freearg((arg_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
        free(*(void **)(in_RDI + 2));
      }
      abort();
    }
    freefield((field_t *)CONCAT44(2,in_stack_fffffffffffffff0));
    free(*(void **)(in_RDI + 2));
  }
  return;
}

Assistant:

void freeattr(struct attr *a) {
    switch (a->kind) {
        case ARRAY:
            freeattr(a->array->type);
            free(a->array);
            break;
        case STRUCTURE:
            freefield(a->structure->field);
            free(a->structure);
            break;
        case FUNCTION:
            freeattr(a->function->return_type);
            freearg(a->function->arg_list);
            free(a->function);
        default:
            abort();
    }
}